

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::TruncateExcessiveDecimals<duckdb::DecimalCastData<short>,true>
               (DecimalCastData<short> *state)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)state->excessive_decimals;
  if (uVar4 == 0) {
    bVar1 = false;
  }
  else {
    uVar3 = (uint)(ushort)state->result;
    do {
      sVar2 = (short)uVar3;
      uVar3 = (int)sVar2 / 10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    state->result = (StoreType)uVar3;
    bVar1 = (int)((int)sVar2 + uVar3 * -10) < -4;
  }
  if ((state->exponent_type == POSITIVE) && (bVar1)) {
    state->result = state->result + -1;
  }
  state->decimal_count = state->scale;
  return true;
}

Assistant:

static bool TruncateExcessiveDecimals(T &state) {
		D_ASSERT(state.excessive_decimals);
		bool round_up = false;
		for (idx_t i = 0; i < state.excessive_decimals; i++) {
			auto mod = state.result % 10;
			round_up = NEGATIVE ? mod <= -5 : mod >= 5;
			state.result /= static_cast<typename T::StoreType>(10.0);
		}
		//! Only round up when exponents are involved
		if (state.exponent_type == ExponentType::POSITIVE && round_up) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		D_ASSERT(state.decimal_count > state.scale);
		state.decimal_count = state.scale;
		return true;
	}